

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

char * libtorrent::parse_int(char *start,char *end,char delimiter,int64_t *val,error_code_enum *ec)

{
  long lVar1;
  error_code_enum eVar2;
  int64_t iVar3;
  
  iVar3 = *val;
  while( true ) {
    if (end <= start) {
      return start;
    }
    if (*start == delimiter) {
      return start;
    }
    if (9 < (byte)(*start - 0x30U)) break;
    if (0xccccccccccccccc < iVar3) {
      eVar2 = overflow;
      goto LAB_0018d3ec;
    }
    lVar1 = iVar3 * 10;
    *val = lVar1;
    if (-0x7fffffffffffffd1 - (long)*start < lVar1) {
      *ec = overflow;
      return start;
    }
    iVar3 = *start + lVar1 + -0x30;
    *val = iVar3;
    start = start + 1;
  }
  eVar2 = expected_digit;
LAB_0018d3ec:
  *ec = eVar2;
  return start;
}

Assistant:

char const* parse_int(char const* start, char const* end, char delimiter
		, std::int64_t& val, bdecode_errors::error_code_enum& ec)
	{
		while (start < end && *start != delimiter)
		{
			if (!numeric(*start))
			{
				ec = bdecode_errors::expected_digit;
				return start;
			}
			if (val > std::numeric_limits<std::int64_t>::max() / 10)
			{
				ec = bdecode_errors::overflow;
				return start;
			}
			val *= 10;
			int digit = *start - '0';
			if (val > std::numeric_limits<std::int64_t>::max() - digit)
			{
				ec = bdecode_errors::overflow;
				return start;
			}
			val += digit;
			++start;
		}
		return start;
	}